

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O1

void __thiscall Fl_Scroll::recalc_scrollbars(Fl_Scroll *this,ScrollInfo *si)

{
  byte bVar1;
  uint uVar2;
  Fl_Widget *pFVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  Fl_Widget **ppFVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar11 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar5 = Fl::box_dx((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).x = iVar5 + iVar11;
  iVar11 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar5 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).y = iVar5 + iVar11;
  iVar11 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar5 = Fl::box_dw((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).w = iVar11 - iVar5;
  iVar11 = (this->super_Fl_Group).super_Fl_Widget.h_;
  iVar5 = Fl::box_dh((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  (si->innerbox).h = iVar11 - iVar5;
  iVar11 = (si->innerbox).x;
  iVar5 = (si->innerbox).y;
  (si->child).l = iVar11;
  (si->child).r = iVar11;
  (si->child).b = iVar5;
  (si->child).t = iVar5;
  ppFVar7 = Fl_Group::array(&this->super_Fl_Group);
  iVar11 = (this->super_Fl_Group).children_;
  if (iVar11 != 0) {
    iVar5 = (si->child).t;
    iVar12 = (si->child).b;
    iVar14 = (si->child).l;
    iVar9 = (si->child).r;
    bVar4 = true;
    lVar8 = 0;
    do {
      pFVar3 = ppFVar7[lVar8];
      if ((Fl_Scrollbar *)pFVar3 != &this->hscrollbar && (Fl_Scrollbar *)pFVar3 != &this->scrollbar)
      {
        iVar13 = pFVar3->x_;
        if (bVar4) {
          (si->child).l = iVar13;
          iVar9 = pFVar3->w_ + iVar13;
          (si->child).r = iVar9;
          iVar5 = pFVar3->y_;
          iVar12 = pFVar3->h_ + iVar5;
          (si->child).b = iVar12;
          (si->child).t = iVar5;
          bVar4 = false;
          iVar14 = iVar13;
        }
        else {
          if (iVar13 < iVar14) {
            (si->child).l = iVar13;
            iVar14 = iVar13;
          }
          iVar10 = pFVar3->y_;
          if (iVar10 < iVar5) {
            (si->child).t = iVar10;
            iVar5 = iVar10;
          }
          iVar13 = iVar13 + pFVar3->w_;
          if (iVar9 < iVar13) {
            (si->child).r = iVar13;
            iVar9 = iVar13;
          }
          iVar10 = iVar10 + pFVar3->h_;
          bVar4 = false;
          if (iVar12 < iVar10) {
            (si->child).b = iVar10;
            iVar12 = iVar10;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (iVar11 != (int)lVar8);
  }
  iVar11 = (si->innerbox).x;
  iVar5 = (si->innerbox).y;
  iVar12 = (si->innerbox).w;
  iVar14 = (si->innerbox).h;
  uVar6 = this->scrollbar_size_;
  if (uVar6 == 0) {
    uVar6 = Fl::scrollbar_size();
  }
  si->scrollsize = uVar6;
  si->hneeded = 0;
  si->vneeded = 0;
  bVar1 = (this->super_Fl_Group).super_Fl_Widget.type_;
  if (((bVar1 & 2) != 0) &&
     ((((bVar1 & 4) != 0 || ((si->child).t < iVar5)) || (iVar14 + iVar5 < (si->child).b)))) {
    si->vneeded = 1;
    iVar12 = iVar12 - uVar6;
    iVar11 = iVar11 + ((int)((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.
                             label_.align_ << 0x1d) >> 0x1f & uVar6);
  }
  if (((bVar1 & 1) != 0) &&
     ((((bVar1 & 4) != 0 || ((si->child).l < iVar11)) || (iVar11 + iVar12 < (si->child).r)))) {
    si->hneeded = 1;
    iVar14 = iVar14 - uVar6;
    uVar2 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
    iVar5 = (-(uVar2 & 1) & uVar6) + iVar5;
    if (((si->vneeded == 0) && ((bVar1 & 2) != 0)) &&
       (((bVar1 & 4) != 0 || (((si->child).t < iVar5 || (iVar5 + iVar14 < (si->child).b)))))) {
      si->vneeded = 1;
      iVar12 = iVar12 - uVar6;
      iVar11 = iVar11 + ((int)(uVar2 << 0x1d) >> 0x1f & uVar6);
    }
  }
  (si->innerchild).x = iVar11;
  (si->innerchild).y = iVar5;
  (si->innerchild).w = iVar12;
  (si->innerchild).h = iVar14;
  (si->hscroll).x = iVar11;
  uVar2 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
  iVar9 = (si->innerbox).y;
  iVar13 = (si->innerbox).x;
  iVar10 = (iVar9 - uVar6) + (si->innerbox).h;
  if ((uVar2 & 1) != 0) {
    iVar10 = iVar9;
  }
  (si->hscroll).y = iVar10;
  (si->hscroll).w = iVar12;
  (si->hscroll).h = uVar6;
  iVar9 = (iVar13 - uVar6) + (si->innerbox).w;
  if ((uVar2 & 4) != 0) {
    iVar9 = iVar13;
  }
  (si->vscroll).x = iVar9;
  (si->vscroll).y = iVar5;
  (si->vscroll).w = uVar6;
  (si->vscroll).h = iVar14;
  iVar9 = (si->child).l;
  (si->hscroll).pos = iVar11 - iVar9;
  (si->hscroll).size = iVar12;
  (si->hscroll).first = 0;
  iVar12 = (si->child).r - iVar9;
  iVar11 = iVar11 - iVar9;
  (si->hscroll).total = iVar12;
  if (iVar11 < 0) {
    (si->hscroll).total = iVar12 - iVar11;
    (si->hscroll).first = iVar11;
  }
  iVar11 = (si->child).t;
  iVar12 = (si->child).b - iVar11;
  iVar5 = iVar5 - iVar11;
  (si->vscroll).pos = iVar5;
  (si->vscroll).size = iVar14;
  (si->vscroll).first = 0;
  (si->vscroll).total = iVar12;
  if (iVar5 < 0) {
    (si->vscroll).total = iVar12 - iVar5;
    (si->vscroll).first = iVar5;
  }
  return;
}

Assistant:

void Fl_Scroll::recalc_scrollbars(ScrollInfo &si) {

  // inner box of widget (excluding scrollbars)
  si.innerbox.x = x()+Fl::box_dx(box());
  si.innerbox.y = y()+Fl::box_dy(box());
  si.innerbox.w = w()-Fl::box_dw(box());
  si.innerbox.h = h()-Fl::box_dh(box());

  // accumulate a bounding box for all the children
  si.child.l = si.innerbox.x;
  si.child.r = si.innerbox.x;
  si.child.b = si.innerbox.y;
  si.child.t = si.innerbox.y;
  int first = 1;
  Fl_Widget*const* a = array();
  for (int i=children(); i--;) {
    Fl_Widget* o = *a++;
    if ( o==&scrollbar || o==&hscrollbar ) continue;
    if ( first ) {
        first = 0;
	si.child.l = o->x();
	si.child.r = o->x()+o->w();
	si.child.b = o->y()+o->h();
	si.child.t = o->y();
    } else {
	if (o->x() < si.child.l) si.child.l = o->x();
	if (o->y() < si.child.t) si.child.t = o->y();
	if (o->x()+o->w() > si.child.r) si.child.r = o->x()+o->w();
	if (o->y()+o->h() > si.child.b) si.child.b = o->y()+o->h();
    }
  }

  // Turn the scrollbars on and off as necessary.
  // See if children would fit if we had no scrollbars...
  {
    int X = si.innerbox.x;
    int Y = si.innerbox.y;
    int W = si.innerbox.w;
    int H = si.innerbox.h;

    si.scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
    si.vneeded = 0;
    si.hneeded = 0;
    if (type() & VERTICAL) {
      if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	si.vneeded = 1;
	W -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
      }
    }
    if (type() & HORIZONTAL) {
      if ((type() & ALWAYS_ON) || si.child.l < X || si.child.r > X+W) {
	si.hneeded = 1;
	H -= si.scrollsize;
	if (scrollbar.align() & FL_ALIGN_TOP) Y += si.scrollsize;
	// recheck vertical since we added a horizontal scrollbar
	if (!si.vneeded && (type() & VERTICAL)) {
	  if ((type() & ALWAYS_ON) || si.child.t < Y || si.child.b > Y+H) {
	    si.vneeded = 1;
	    W -= si.scrollsize;
	    if (scrollbar.align() & FL_ALIGN_LEFT) X += si.scrollsize;
	  }
	}
      }
    }
    si.innerchild.x = X;
    si.innerchild.y = Y;
    si.innerchild.w = W;
    si.innerchild.h = H;
  }

  // calculate hor scrollbar position
  si.hscroll.x = si.innerchild.x;
  si.hscroll.y = (scrollbar.align() & FL_ALIGN_TOP)
		     ? si.innerbox.y
		     : si.innerbox.y + si.innerbox.h - si.scrollsize;
  si.hscroll.w = si.innerchild.w;
  si.hscroll.h = si.scrollsize;

  // calculate ver scrollbar position
  si.vscroll.x = (scrollbar.align() & FL_ALIGN_LEFT)
                     ? si.innerbox.x
		     : si.innerbox.x + si.innerbox.w - si.scrollsize;
  si.vscroll.y = si.innerchild.y;
  si.vscroll.w = si.scrollsize;
  si.vscroll.h = si.innerchild.h;

  // calculate h/v scrollbar values (pos/size/first/total)
  si.hscroll.pos = si.innerchild.x - si.child.l;
  si.hscroll.size = si.innerchild.w;
  si.hscroll.first = 0;
  si.hscroll.total = si.child.r - si.child.l;
  if ( si.hscroll.pos < 0 ) { si.hscroll.total += (-si.hscroll.pos); si.hscroll.first = si.hscroll.pos; }

  si.vscroll.pos = si.innerchild.y - si.child.t;
  si.vscroll.size = si.innerchild.h;
  si.vscroll.first = 0;
  si.vscroll.total = si.child.b - si.child.t;
  if ( si.vscroll.pos < 0 ) { si.vscroll.total += (-si.vscroll.pos); si.vscroll.first = si.vscroll.pos; }

//  printf("DEBUG --- ScrollInfo ---\n");
//  printf("DEBUG        scrollsize: %d\n", si.scrollsize);
//  printf("DEBUG  hneeded, vneeded: %d %d\n", si.hneeded, si.vneeded);
//  printf("DEBUG     innerbox.x, si.innerbox.y, si.innerbox.w,si.innerbox.h);
//  printf("DEBUG   innerchild.xywh: %d %d %d %d\n", si.innerchild.x, si.innerchild.y, si.innerchild.w, si.innerchild.h);
//  printf("DEBUG        child lrbt: %d %d %d %d\n", si.child.l, si.child.r, si.child.b, si.child.t);
//  printf("DEBUG      hscroll xywh: %d %d %d %d\n", si.hscroll.x, si.hscroll.y, si.hscroll.w, si.hscroll.h);
//  printf("DEBUG      vscroll xywh: %d %d %d %d\n", si.vscroll.x, si.vscroll.y, si.vscroll.w, si.vscroll.h);
//  printf("DEBUG  horz scroll vals: %d %d %d %d\n", si.hscroll.pos, si.hscroll.size, si.hscroll.first, si.hscroll.total);
//  printf("DEBUG  vert scroll vals: %d %d %d %d\n", si.vscroll.pos, si.vscroll.size, si.vscroll.first, si.vscroll.total);
//  printf("DEBUG \n");
}